

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O2

Value * __thiscall
cmFileAPI::BuildClientReply(Value *__return_storage_ptr__,cmFileAPI *this,ClientQuery *q)

{
  Value *pVVar1;
  bool bVar2;
  Value *this_00;
  Value *pVVar3;
  Value local_50;
  
  BuildReply(__return_storage_ptr__,this,&q->DirQuery);
  if (q->HaveQueryJson == true) {
    this_00 = Json::Value::operator[](__return_storage_ptr__,"query.json");
    if ((q->QueryJson).Error._M_string_length == 0) {
      pVVar1 = &(q->QueryJson).ClientValue;
      bVar2 = Json::Value::isNull(pVVar1);
      if (!bVar2) {
        pVVar3 = Json::Value::operator[](this_00,"client");
        Json::Value::operator=(pVVar3,pVVar1);
      }
      pVVar1 = &(q->QueryJson).RequestsValue;
      bVar2 = Json::Value::isNull(pVVar1);
      if (!bVar2) {
        pVVar3 = Json::Value::operator[](this_00,"requests");
        Json::Value::operator=(pVVar3,pVVar1);
      }
      BuildClientReplyResponses(&local_50,this,&(q->QueryJson).Requests);
      this_00 = Json::Value::operator[](this_00,"responses");
    }
    else {
      BuildReplyError(&local_50,&(q->QueryJson).Error);
    }
    Json::Value::operator=(this_00,&local_50);
    Json::Value::~Value(&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

Json::Value cmFileAPI::BuildClientReply(ClientQuery const& q)
{
  Json::Value reply = this->BuildReply(q.DirQuery);

  if (!q.HaveQueryJson) {
    return reply;
  }

  Json::Value& reply_query_json = reply["query.json"];
  ClientQueryJson const& qj = q.QueryJson;

  if (!qj.Error.empty()) {
    reply_query_json = this->BuildReplyError(qj.Error);
    return reply;
  }

  if (!qj.ClientValue.isNull()) {
    reply_query_json["client"] = qj.ClientValue;
  }

  if (!qj.RequestsValue.isNull()) {
    reply_query_json["requests"] = qj.RequestsValue;
  }

  reply_query_json["responses"] = this->BuildClientReplyResponses(qj.Requests);

  return reply;
}